

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O1

void cmFortranParser_RuleLineDirective(cmFortranParser *parser,char *filename)

{
  bool bVar1;
  string included;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,filename,&local_31);
  if ((local_30._M_string_length != 0) && (*local_30._M_dataplus._M_p != '<')) {
    cmsys::SystemTools::ReplaceString(&local_30,"\\\\","\\");
    cmsys::SystemTools::ConvertToUnixSlashes(&local_30);
    bVar1 = cmsys::SystemTools::FileExists(&local_30,true);
    if (bVar1) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&parser->Info->Includes,&local_30);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmFortranParser_RuleLineDirective(cmFortranParser* parser,
                                       const char* filename)
{
  // This is a #line directive naming a file encountered during preprocessing.
  std::string included = filename;

  // Skip #line directives referencing non-files like
  // "<built-in>" or "<command-line>".
  if (included.empty() || included[0] == '<') {
    return;
  }

  // Fix windows file path separators since our lexer does not
  // process escape sequences in string literals.
  cmSystemTools::ReplaceString(included, "\\\\", "\\");
  cmSystemTools::ConvertToUnixSlashes(included);

  // Save the named file as included in the source.
  if (cmSystemTools::FileExists(included, true)) {
    parser->Info.Includes.insert(included);
  }
}